

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  Report *this_00;
  bool bVar1;
  int extraout_EAX;
  vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
  *pvVar2;
  size_type sVar3;
  reference this_01;
  pointer expr;
  reference ppVVar4;
  ConstantArray *pCVar5;
  SourceLocation *sloc;
  undefined4 in_register_00000034;
  allocator<char> local_b9;
  string local_b8;
  Value *local_98;
  Value *local_90;
  Value *value;
  iterator __end3;
  iterator __begin3;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *__range3;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> constants;
  Value *element;
  size_t e;
  size_t i;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> values;
  ArrayExpr *arrayExpr_local;
  IRGenerator *this_local;
  
  values.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(in_register_00000034,__fd);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&i);
  e = 0;
  pvVar2 = ArrayExpr::values((ArrayExpr *)
                             values.
                             super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar3 = std::
          vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
          ::size(pvVar2);
  for (; e != sVar3; e = e + 1) {
    pvVar2 = ArrayExpr::values((ArrayExpr *)
                               values.
                               super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_01 = std::
              vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
              ::operator[](pvVar2,e);
    expr = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get(this_01);
    constants.super__Vector_base<flow::Constant_*,_std::allocator<flow::Constant_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)codegen(this,expr);
    std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::push_back
              ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&i,
               (value_type *)
               &constants.super__Vector_base<flow::Constant_*,_std::allocator<flow::Constant_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  bVar1 = isConstant((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&i);
  if (bVar1) {
    std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::vector
              ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)&__range3);
    sVar3 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::size
                      ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&i);
    std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::reserve
              ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)&__range3,sVar3);
    __end3 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::begin
                       ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&i);
    value = (Value *)std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::end
                               ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&i);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<flow::Value_**,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
                                  *)&value);
      if (!bVar1) break;
      ppVVar4 = __gnu_cxx::
                __normal_iterator<flow::Value_**,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
                ::operator*(&__end3);
      local_98 = *ppVVar4;
      local_90 = local_98;
      std::vector<flow::Constant*,std::allocator<flow::Constant*>>::emplace_back<flow::Constant*>
                ((vector<flow::Constant*,std::allocator<flow::Constant*>> *)&__range3,
                 (Constant **)&local_98);
      __gnu_cxx::
      __normal_iterator<flow::Value_**,_std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>_>
      ::operator++(&__end3);
    }
    pCVar5 = IRBuilder::get(&this->super_IRBuilder,
                            (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)&__range3
                           );
    this->result_ = (Value *)pCVar5;
    std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::~vector
              ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)&__range3);
  }
  else {
    this_00 = this->report_;
    sloc = ASTNode::location((ASTNode *)
                             values.
                             super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"VariableSym array elements not allowed.",&local_b9);
    diagnostics::Report::typeError<>(this_00,sloc,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    this->result_ = (Value *)0x0;
  }
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&i);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(ArrayExpr& arrayExpr) {
  std::vector<Value*> values;
  for (size_t i = 0, e = arrayExpr.values().size(); i != e; ++i) {
    Value* element = codegen(arrayExpr.values()[i].get());
    values.push_back(element);
  }

  if (isConstant(values)) {
    std::vector<Constant*> constants;
    constants.reserve(values.size());
    for (Value* value : values)
      constants.emplace_back(static_cast<Constant*>(value));

    result_ = get(constants);
  } else {
    report_->typeError(arrayExpr.location(), "VariableSym array elements not allowed.");
    result_ = nullptr;
  }
}